

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O0

char * read_map(fastObjData *data,char *ptr,fastObjTexture *map)

{
  int iVar1;
  char *pcVar2;
  char *s_00;
  char *path;
  char *name;
  char *e;
  char *s;
  fastObjTexture *map_local;
  char *ptr_local;
  fastObjData *data_local;
  
  data_local = (fastObjData *)skip_whitespace(ptr);
  map_local = (fastObjTexture *)data_local;
  if (*(char *)&data_local->mesh != '-') {
    while (iVar1 = is_end_of_name(*(char *)&map_local->name), iVar1 == 0) {
      map_local = (fastObjTexture *)((long)&map_local->name + 1);
    }
    pcVar2 = string_copy((char *)data_local,(char *)map_local);
    s_00 = string_concat(data->base,(char *)data_local,(char *)map_local);
    string_fix_separators(s_00);
    map->name = pcVar2;
    map->path = s_00;
    data_local = (fastObjData *)map_local;
  }
  return (char *)data_local;
}

Assistant:

static
const char* read_map(fastObjData* data, const char* ptr, fastObjTexture* map)
{
   const char* s;
   const char* e;
   char*       name;
   char*       path;

   ptr = skip_whitespace(ptr);

   /* Don't support options at present */
   if (*ptr == '-')
       return ptr;


   /* Read name */
   s = ptr;
   while (!is_end_of_name(*ptr))
       ptr++;

   e = ptr;

   name = string_copy(s, e);

   path = string_concat(data->base, s, e);
   string_fix_separators(path);

   map->name = name;
   map->path = path;

   return e;
}